

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_sl_clip.h
# Opt level: O3

void __thiscall
agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
          (rasterizer_sl_clip<agg::ras_conv_int> *this,rasterizer_cells_aa<agg::cell_aa> *ras,
          coord_type x2,coord_type y2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int y1;
  coord_type x1;
  uint uVar4;
  int x1_00;
  int iVar5;
  uint f2;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  coord_type cVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  uint f1;
  
  if (this->m_clipping != true) {
    rasterizer_cells_aa<agg::cell_aa>::line(ras,this->m_x1,this->m_y1,x2,y2);
    goto LAB_00112803;
  }
  iVar5 = (this->m_clip_box).x2;
  iVar1 = (this->m_clip_box).y2;
  x1_00 = (this->m_clip_box).x1;
  iVar2 = (this->m_clip_box).y1;
  uVar3 = (uint)(iVar5 < x2) + (uint)(iVar1 < y2) * 2 + (uint)(x2 < x1_00) * 4;
  f2 = uVar3 + (uint)(y2 < iVar2) * 8;
  f1 = this->m_f1;
  if (((f1 & 10) != 0) && ((f1 & 10) == (f2 & 0xfffffffa))) {
    this->m_x1 = x2;
    this->m_y1 = y2;
    this->m_f1 = f2;
    return;
  }
  uVar3 = (uVar3 & 0xfffffffd) + (f1 & 5) * 2;
  if (0xc < uVar3) goto switchD_0011238c_caseD_5;
  x1 = this->m_x1;
  y1 = this->m_y1;
  switch(uVar3) {
  case 0:
    x1_00 = x2;
    break;
  case 1:
    dVar11 = ((double)(y2 - y1) * (double)(iVar5 - x1)) / (double)(x2 - x1);
    cVar10 = (int)(dVar11 + *(double *)(&DAT_0011da20 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < cVar10) * 2 + (uint)(cVar10 < iVar2) * 8;
    goto LAB_00112726;
  case 2:
    dVar11 = ((double)(y2 - y1) * (double)(iVar5 - x1)) / (double)(x2 - x1);
    iVar17 = (int)(dVar11 + *(double *)(&DAT_0011da20 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < iVar17) * 2 + (uint)(iVar17 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,iVar5,y1,iVar5,iVar17,f1,uVar3);
    x1_00 = x2;
    x1 = (this->m_clip_box).x2;
    y1 = iVar17;
    f1 = uVar3;
    break;
  case 3:
    x1_00 = iVar5;
    x1 = iVar5;
    break;
  case 4:
    dVar11 = ((double)(y2 - y1) * (double)(x1_00 - x1)) / (double)(x2 - x1);
    cVar10 = (int)(dVar11 + *(double *)(&DAT_0011da20 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < cVar10) * 2 + (uint)(cVar10 < iVar2) * 8;
    goto LAB_001127c1;
  default:
    goto switchD_0011238c_caseD_5;
  case 6:
    dVar11 = (double)(x2 - x1);
    auVar12._0_8_ = (double)(y2 - y1) * (double)(x1_00 - x1);
    auVar12._8_8_ = (double)(y2 - y1) * (double)(iVar5 - x1);
    auVar6._8_8_ = dVar11;
    auVar6._0_8_ = dVar11;
    auVar15 = divpd(auVar12,auVar6);
    auVar7._8_8_ = -(ulong)(auVar15._8_8_ < 0.0);
    auVar7._0_8_ = -(ulong)(auVar15._0_8_ < 0.0);
    auVar18 = blendvpd(_DAT_0011d9c0,_DAT_0011da10,auVar7);
    cVar10 = y1 + (int)(auVar18._0_8_ + auVar15._0_8_);
    iVar17 = y1 + (int)(auVar18._8_8_ + auVar15._8_8_);
    auVar8._4_4_ = iVar1;
    auVar8._0_4_ = iVar1;
    auVar8._8_8_ = 0;
    auVar13._0_4_ = -(uint)(iVar1 < cVar10);
    auVar13._4_4_ = -(uint)(iVar1 < iVar17);
    auVar13._8_8_ = 0;
    auVar15 = pmovsxdq(auVar8,auVar13);
    uVar3 = movmskpd(x2 - x1,auVar15);
    uVar4 = (uVar3 & 0xfffffffe) + (uint)(iVar17 < iVar2) * 8;
    uVar3 = (uVar3 & 1) * 2 + (uint)(cVar10 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,iVar5,y1,iVar5,iVar17,f1,uVar4);
    x1_00 = (this->m_clip_box).x1;
    x1 = (this->m_clip_box).x2;
    y1 = iVar17;
    f1 = uVar4;
LAB_001127c1:
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,x1_00,cVar10,f1,uVar3);
    x1_00 = (this->m_clip_box).x1;
    x1 = x1_00;
    y1 = cVar10;
    f1 = uVar3;
    break;
  case 8:
    dVar11 = ((double)(y2 - y1) * (double)(x1_00 - x1)) / (double)(x2 - x1);
    iVar5 = (int)(dVar11 + *(double *)(&DAT_0011da20 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < iVar5) * 2 + (uint)(iVar5 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1_00,y1,x1_00,iVar5,f1,uVar3);
    x1_00 = x2;
    x1 = (this->m_clip_box).x1;
    y1 = iVar5;
    f1 = uVar3;
    break;
  case 9:
    auVar14._0_8_ = (double)(y2 - y1) * (double)(iVar5 - x1);
    auVar14._8_8_ = (double)(y2 - y1) * (double)(x1_00 - x1);
    auVar15._8_8_ = (double)(x2 - x1);
    auVar15._0_8_ = (double)(x2 - x1);
    auVar15 = divpd(auVar14,auVar15);
    auVar18._8_8_ = -(ulong)(auVar15._8_8_ < 0.0);
    auVar18._0_8_ = -(ulong)(auVar15._0_8_ < 0.0);
    auVar18 = blendvpd(_DAT_0011d9c0,_DAT_0011da10,auVar18);
    cVar10 = y1 + (int)(auVar18._0_8_ + auVar15._0_8_);
    iVar17 = y1 + (int)(auVar18._8_8_ + auVar15._8_8_);
    auVar9._4_4_ = iVar1;
    auVar9._0_4_ = iVar1;
    auVar9._8_8_ = 0;
    auVar16._0_4_ = -(uint)(iVar1 < cVar10);
    auVar16._4_4_ = -(uint)(iVar1 < iVar17);
    auVar16._8_8_ = 0;
    auVar15 = pmovsxdq(auVar9,auVar16);
    uVar3 = movmskpd(x1,auVar15);
    uVar4 = (uVar3 & 0xfffffffe) + (uint)(iVar17 < iVar2) * 8;
    uVar3 = (uVar3 & 1) * 2 + (uint)(cVar10 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1_00,y1,x1_00,iVar17,f1,uVar4);
    x1 = (this->m_clip_box).x1;
    iVar5 = (this->m_clip_box).x2;
    y1 = iVar17;
    f1 = uVar4;
LAB_00112726:
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,iVar5,cVar10,f1,uVar3);
    x1_00 = (this->m_clip_box).x2;
    x1 = x1_00;
    y1 = cVar10;
    f1 = uVar3;
    break;
  case 0xc:
    x1 = x1_00;
  }
  line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,x1_00,y2,f1,f2);
switchD_0011238c_caseD_5:
  this->m_f1 = f2;
LAB_00112803:
  this->m_x1 = x2;
  this->m_y1 = y2;
  return;
}

Assistant:

void line_to(Rasterizer& ras, coord_type x2, coord_type y2)
        {
            if(m_clipping)
            {
                unsigned f2 = clipping_flags(x2, y2, m_clip_box);

                if((m_f1 & 10) == (f2 & 10) && (m_f1 & 10) != 0)
                {
                    // Invisible by Y
                    m_x1 = x2;
                    m_y1 = y2;
                    m_f1 = f2;
                    return;
                }

                coord_type x1 = m_x1;
                coord_type y1 = m_y1;
                unsigned   f1 = m_f1;
                coord_type y3, y4;
                unsigned   f3, f4;

                switch(((f1 & 5) << 1) | (f2 & 5))
                {
                case 0: // Visible by X
                    line_clip_y(ras, x1, y1, x2, y2, f1, f2);
                    break;

                case 1: // x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x2, y2, f3, f2);
                    break;

                case 2: // x1 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, x2, y2, f3, f2);
                    break;

                case 3: // x1 > clip.x2 && x2 > clip.x2
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y2, f1, f2);
                    break;

                case 4: // x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x1, y2, f3, f2);
                    break;

                case 6: // x1 > clip.x2 && x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x1, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x1, y4, m_clip_box.x1, y2, f4, f2);
                    break;

                case 8: // x1 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, x2, y2, f3, f2);
                    break;

                case 9:  // x1 < clip.x1 && x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x2, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x2, y4, m_clip_box.x2, y2, f4, f2);
                    break;

                case 12: // x1 < clip.x1 && x2 < clip.x1
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y2, f1, f2);
                    break;
                }
                m_f1 = f2;
            }
            else
            {
                ras.line(Conv::xi(m_x1), Conv::yi(m_y1), 
                         Conv::xi(x2),   Conv::yi(y2)); 
            }
            m_x1 = x2;
            m_y1 = y2;
        }